

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_conf_has_static_psk(mbedtls_ssl_config *conf)

{
  int iVar1;
  
  iVar1 = 0;
  if (((conf->psk_identity != (uchar *)0x0) && (iVar1 = 0, conf->psk_identity_len != 0)) &&
     ((conf->psk == (uchar *)0x0 || (iVar1 = 1, conf->psk_len == 0)))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_conf_has_static_psk(mbedtls_ssl_config const *conf)
{
    if (conf->psk_identity     == NULL ||
        conf->psk_identity_len == 0) {
        return 0;
    }

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if (!mbedtls_svc_key_id_is_null(conf->psk_opaque)) {
        return 1;
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

    if (conf->psk != NULL && conf->psk_len != 0) {
        return 1;
    }

    return 0;
}